

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O3

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::swap
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode1,
          BNode<ADS::NodeDistancePairClass_*> *pNode1Prev,
          BNode<ADS::NodeDistancePairClass_*> *pNode2,
          BNode<ADS::NodeDistancePairClass_*> *pNode2Prev)

{
  uint uVar1;
  BNode<ADS::NodeDistancePairClass_*> *pBVar2;
  BNode<ADS::NodeDistancePairClass_*> *pBVar3;
  BNode<ADS::NodeDistancePairClass_*> *pBVar4;
  Node<ADS::NodeDistancePairClass_*> **ppNVar5;
  Node<ADS::NodeDistancePairClass_*> **ppNVar6;
  BNode<ADS::NodeDistancePairClass_*> *pBVar7;
  BNode<ADS::NodeDistancePairClass_*> *pBVar8;
  double in_XMM0_Qa;
  
  pBVar3 = pNode1;
  pBVar4 = pNode2;
  if ((pNode1->pParent != pNode2) && (pBVar3 = pNode2, pBVar4 = pNode1, pNode2->pParent != pNode1))
  {
    log(in_XMM0_Qa);
    exit(1);
  }
  pBVar2 = pBVar3->pFirstChild;
  if (pBVar2 != pBVar4 && pBVar2 != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
    pBVar2->pParent = pBVar4;
    for (pBVar7 = (BNode<ADS::NodeDistancePairClass_*> *)
                  (pBVar2->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling; pBVar7 != pBVar2
        ; pBVar7 = (BNode<ADS::NodeDistancePairClass_*> *)
                   (pBVar7->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling) {
      pBVar7->pParent = pBVar4;
    }
  }
  pBVar7 = (BNode<ADS::NodeDistancePairClass_*> *)
           (pBVar3->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  if (pBVar7 != pBVar3 && pBVar7 != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
    pBVar7->pParent = pBVar3;
    for (pBVar8 = (BNode<ADS::NodeDistancePairClass_*> *)
                  (pBVar7->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling; pBVar8 != pBVar7
        ; pBVar8 = (BNode<ADS::NodeDistancePairClass_*> *)
                   (pBVar8->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling) {
      pBVar8->pParent = pBVar3;
    }
  }
  pBVar3->pParent = pBVar4->pParent;
  pBVar4->pParent = pBVar3;
  pBVar4->pFirstChild = pBVar2;
  pBVar3->pFirstChild = pBVar4;
  pBVar2 = pBVar3->pParent;
  if ((pBVar2 != (BNode<ADS::NodeDistancePairClass_*> *)0x0) && (pBVar2->pFirstChild == pBVar4)) {
    pBVar2->pFirstChild = pBVar3;
  }
  uVar1 = pNode1->uiDegree;
  pNode1->uiDegree = pNode2->uiDegree;
  pNode2->uiDegree = uVar1;
  ppNVar5 = &(pNode1->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  pBVar3 = (BNode<ADS::NodeDistancePairClass_*> *)
           (pNode1->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  pBVar4 = (BNode<ADS::NodeDistancePairClass_*> *)
           (pNode2->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  if (pBVar4 != pNode2) {
    *ppNVar5 = (Node<ADS::NodeDistancePairClass_*> *)pBVar4;
    ppNVar5 = &(pNode2Prev->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  }
  ppNVar6 = &(pNode2->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  *ppNVar5 = &pNode1->super_Node<ADS::NodeDistancePairClass_*>;
  if (pBVar3 != pNode1) {
    *ppNVar6 = (Node<ADS::NodeDistancePairClass_*> *)pBVar3;
    ppNVar6 = &(pNode1Prev->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling;
  }
  *ppNVar6 = &pNode2->super_Node<ADS::NodeDistancePairClass_*>;
  return;
}

Assistant:

void BHeap<T, Comparator>::swap (BNode<T> *pNode1, BNode<T> *pNode1Prev,
                                     BNode<T> *pNode2, BNode<T> *pNode2Prev)
    {
        if ((pNode1->pParent != pNode2) && (pNode2->pParent != pNode1)) {
            log ("Error! Only parent/child nodes can be swapped\n");
            exit (1);
        }

        /* Update parent/child links */
        BNode<T> *pParent, *pChild;
        if (pNode1->pParent == pNode2) {
            pParent = pNode2;
            pChild = pNode1;
        }
        else {
            pParent = pNode1;
            pChild = pNode2;
        }

        updateParent (pChild->pFirstChild, pParent);
        updateParent (static_cast<BNode<T>*>(pChild->pRightSibling), pChild);

        pChild->pParent = pParent->pParent;
        pParent->pParent = pChild;
        pParent->pFirstChild = pChild->pFirstChild;
        pChild->pFirstChild = pParent;

        /* update new pChild's parent link to it*/
        if (pChild->pParent != NULL && pChild->pParent->pFirstChild == pParent)
            /* if pChild->pParent->pFirstChild points to one of previous
               pParent's siblings there is not need to update it, otherwise
               make it point to pChild */
            pChild->pParent->pFirstChild = pChild;
        
        unsigned int uiTmpDegree = pNode1->uiDegree;
        pNode1->uiDegree = pNode2->uiDegree;
        pNode2->uiDegree = uiTmpDegree;

       /* T elementTmp = pNode1->el;
        pNode1->el = pNode2->el;
        pNode2->el = elementTmp;*/

        /* Update sibling links */
        BNode<T> *pTmp = pNode1->getSibling();
        if (pNode2->getSibling() == pNode2) {
            pNode1->setSibling (pNode1);                
        }
        else {
            pNode1->setSibling (pNode2->getSibling());            
            pNode2Prev->pRightSibling = pNode1;
        }
        
        if (pTmp == pNode1) {
            pNode2->setSibling (pNode2);
        }
        else {
            pNode2->setSibling (pTmp);
            pNode1Prev->pRightSibling = pNode2;
        }
    }